

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall p2t::Sweep::FinalizationPolygon(Sweep *this,SweepContext *tcx)

{
  Point *p_00;
  bool bVar1;
  AdvancingFront *pAVar2;
  Node *pNVar3;
  Point *p;
  Triangle *t;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  pAVar2 = SweepContext::front(tcx);
  pNVar3 = AdvancingFront::head(pAVar2);
  p = (Point *)pNVar3->next->triangle;
  pAVar2 = SweepContext::front(tcx);
  pNVar3 = AdvancingFront::head(pAVar2);
  p_00 = pNVar3->next->point;
  while( true ) {
    bVar1 = Triangle::GetConstrainedEdgeCW((Triangle *)p,p_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    p = (Point *)Triangle::NeighborCCW((Triangle *)p,p_00);
  }
  SweepContext::MeshClean(tcx,(Triangle *)p);
  return;
}

Assistant:

void Sweep::FinalizationPolygon(SweepContext& tcx)
{
  // Get an Internal triangle to start with
  Triangle* t = tcx.front()->head()->next->triangle;
  Point* p = tcx.front()->head()->next->point;
  while (!t->GetConstrainedEdgeCW(*p)) {
    t = t->NeighborCCW(*p);
  }

  // Collect interior triangles constrained by edges
  tcx.MeshClean(*t);
}